

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

proficiency_type * __thiscall
CProficiencies::GetProficiency
          (proficiency_type *__return_storage_ptr__,CProficiencies *this,char *profname)

{
  char *pcVar1;
  int iVar2;
  pointer ppVar3;
  bool bVar4;
  long lVar5;
  pointer ppVar6;
  pointer ppVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  
  ppVar3 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (profname != (char *)0x0) {
    lVar5 = ((long)prof_table.
                   super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)prof_table.
                   super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 >> 2;
    ppVar6 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      ppVar6 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
               _M_impl.super__Vector_impl_data._M_start + 2;
      do {
        ppVar7 = ppVar6;
        if ((ppVar7[-2].name != (char *)0x0) && (bVar4 = str_cmp(ppVar7[-2].name,profname), !bVar4))
        {
          ppVar7 = ppVar7 + -2;
          goto LAB_00377e45;
        }
        if ((ppVar7[-1].name != (char *)0x0) && (bVar4 = str_cmp(ppVar7[-1].name,profname), !bVar4))
        {
          ppVar7 = ppVar7 + -1;
          goto LAB_00377e45;
        }
        if ((ppVar7->name != (char *)0x0) && (bVar4 = str_cmp(ppVar7->name,profname), !bVar4))
        goto LAB_00377e45;
        if ((ppVar7[1].name != (char *)0x0) && (bVar4 = str_cmp(ppVar7[1].name,profname), !bVar4)) {
          ppVar7 = ppVar7 + 1;
          goto LAB_00377e45;
        }
        lVar5 = lVar5 + -1;
        ppVar6 = ppVar7 + 4;
      } while (1 < lVar5);
      ppVar6 = ppVar7 + 2;
    }
    lVar5 = ((long)ppVar3 - (long)ppVar6 >> 3) * -0x3333333333333333;
    if (lVar5 == 1) {
LAB_00377e10:
      ppVar7 = ppVar3;
      if ((ppVar6->name != (char *)0x0) &&
         (bVar4 = str_cmp(ppVar6->name,profname), ppVar7 = ppVar6, bVar4)) {
        ppVar7 = ppVar3;
      }
    }
    else if (lVar5 == 2) {
LAB_00377dee:
      if ((ppVar6->name == (char *)0x0) ||
         (bVar4 = str_cmp(ppVar6->name,profname), ppVar7 = ppVar6, bVar4)) {
        ppVar6 = ppVar6 + 1;
        goto LAB_00377e10;
      }
    }
    else {
      ppVar7 = ppVar3;
      if ((lVar5 == 3) &&
         ((ppVar6->name == (char *)0x0 ||
          (bVar4 = str_cmp(ppVar6->name,profname), ppVar7 = ppVar6, bVar4)))) {
        ppVar6 = ppVar6 + 1;
        goto LAB_00377dee;
      }
    }
LAB_00377e45:
    if (ppVar7 != prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __return_storage_ptr__->flags = ppVar7->flags;
      uVar8 = *(undefined4 *)&ppVar7->ppsn;
      uVar9 = *(undefined4 *)((long)&ppVar7->ppsn + 4);
      uVar10 = *(undefined4 *)&ppVar7->name;
      uVar11 = *(undefined4 *)((long)&ppVar7->name + 4);
      iVar2 = ppVar7->minlevel;
      pcVar1 = ppVar7->requires;
      __return_storage_ptr__->cost = ppVar7->cost;
      __return_storage_ptr__->minlevel = iVar2;
      __return_storage_ptr__->requires = pcVar1;
      goto LAB_00377e7f;
    }
  }
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->cost = 0;
  __return_storage_ptr__->minlevel = 0;
  __return_storage_ptr__->requires = (char *)0x0;
  uVar8 = 0x50051a;
  uVar9 = 0;
  uVar10 = 0x3a5dc4;
  uVar11 = 0;
LAB_00377e7f:
  *(undefined4 *)&__return_storage_ptr__->ppsn = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->ppsn + 4) = uVar9;
  *(undefined4 *)&__return_storage_ptr__->name = uVar10;
  *(undefined4 *)((long)&__return_storage_ptr__->name + 4) = uVar11;
  return __return_storage_ptr__;
}

Assistant:

proficiency_type CProficiencies::GetProficiency(char* profname)
{
	proficiency_type result = { &psn_none, "", 0, 0, nullptr, PFLAGS_NONE };
	if(profname == nullptr)
		return result;

	auto it = std::find_if(prof_table.begin(), prof_table.end(), [profname] (auto prof) {
		return prof.name != nullptr && !str_cmp(prof.name, profname);
	});

	if (it == prof_table.end())
		return result;
	
	auto idx = it - prof_table.begin();
	return prof_table[idx];
}